

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.cpp
# Opt level: O1

void __thiscall
enact::TupleTypename::TupleTypename
          (TupleTypename *this,
          vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
          *elementTypenames,Token *paren)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  pointer puVar4;
  undefined8 uVar5;
  int iVar6;
  ostream *poVar7;
  undefined4 extraout_var;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *elementTypename;
  pointer puVar8;
  string separator;
  ostringstream name;
  char *local_1f0;
  char *local_1e8;
  char local_1e0;
  undefined7 uStack_1df;
  TupleTypename *local_1d0;
  string local_1c8;
  undefined7 uStack_1c7;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  (this->super_Typename)._vptr_Typename = (_func_int **)&PTR__TupleTypename_001299c0;
  (this->m_elementTypenames).
  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (elementTypenames->
       super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->m_elementTypenames).
  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (elementTypenames->
       super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  (this->m_elementTypenames).
  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (elementTypenames->
       super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (elementTypenames->
  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (elementTypenames->
  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (elementTypenames->
  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_paren).type = paren->type;
  paVar1 = &(this->m_paren).lexeme.field_2;
  (this->m_paren).lexeme._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (paren->lexeme)._M_dataplus._M_p;
  paVar2 = &(paren->lexeme).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar5 = *(undefined8 *)((long)&(paren->lexeme).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_paren).lexeme.field_2 + 8) = uVar5;
  }
  else {
    (this->m_paren).lexeme._M_dataplus._M_p = pcVar3;
    (this->m_paren).lexeme.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_paren).lexeme._M_string_length = (paren->lexeme)._M_string_length;
  (paren->lexeme)._M_dataplus._M_p = (pointer)paVar2;
  (paren->lexeme)._M_string_length = 0;
  (paren->lexeme).field_2._M_local_buf[0] = '\0';
  (this->m_paren).col = paren->col;
  (this->m_paren).line = paren->line;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  local_1d0 = this;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_1f0 = &local_1e0;
  local_1e8 = (char *)0x0;
  local_1e0 = '\0';
  local_1c8 = (string)0x28;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1c8,1);
  puVar8 = (this->m_elementTypenames).
           super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->m_elementTypenames).
           super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar8 != puVar4) {
    do {
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1f0,(long)local_1e8);
      iVar6 = (*((puVar8->_M_t).
                 super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>
                 .super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl)->
                _vptr_Typename[4])();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,*(char **)CONCAT44(extraout_var,iVar6),
                 ((undefined8 *)CONCAT44(extraout_var,iVar6))[1]);
      std::__cxx11::string::_M_replace((ulong)&local_1f0,0,local_1e8,0x11f24d);
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar4);
  }
  local_1c8 = (string)0x29;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1c8,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->m_name,&local_1c8);
  if ((long *)CONCAT71(uStack_1c7,local_1c8) != local_1b8) {
    operator_delete((long *)CONCAT71(uStack_1c7,local_1c8),local_1b8[0] + 1);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,CONCAT71(uStack_1df,local_1e0) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

TupleTypename::TupleTypename(std::vector<std::unique_ptr<const Typename>> elementTypenames, Token paren) :
            m_elementTypenames{std::move(elementTypenames)},
            m_paren{std::move(paren)} {
        std::ostringstream name;
        std::string separator;

        name << '(';
        for (const auto& elementTypename : m_elementTypenames) {
            name << separator << elementTypename->name();
            separator = ", ";
        }
        name << ')';

        m_name = name.str();
    }